

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymTab.cpp
# Opt level: O0

void __thiscall SymTab::print(SymTab *this)

{
  bool bVar1;
  reference ppVar2;
  type *ptVar3;
  type *ppTVar4;
  types *ptVar5;
  ostream *poVar6;
  ulong uVar7;
  size_type sVar8;
  reference ppTVar9;
  double dVar10;
  string local_d0;
  int local_ac;
  undefined1 local_a8 [4];
  int i;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> array;
  type *value;
  type *var;
  _Self local_28;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
  *__range1;
  SymTab *this_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
           ::begin(&this->symTab);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
       ::end(&this->symTab);
  while (bVar1 = std::operator!=(&__end1,&local_28), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>
             ::operator*(&__end1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>
            *)&var,ppVar2);
    ptVar3 = std::get<0ul,std::__cxx11::string_const,TypeDescriptor*>
                       ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>
                         *)&var);
    ppTVar4 = std::get<1ul,std::__cxx11::string_const,TypeDescriptor*>
                        ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>
                          *)&var);
    ptVar5 = TypeDescriptor::type(*ppTVar4);
    if (*ptVar5 == NUMBER) {
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)ptVar3);
      poVar6 = std::operator<<(poVar6," = ");
      dVar10 = TypeDescriptor::getNumber(*ppTVar4);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar10);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      ptVar5 = TypeDescriptor::type(*ppTVar4);
      if (*ptVar5 == STRING) {
        poVar6 = std::operator<<((ostream *)&std::cout,(string *)ptVar3);
        poVar6 = std::operator<<(poVar6," = ");
        TypeDescriptor::getString_abi_cxx11_
                  ((string *)
                   &array.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,*ppTVar4);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &array.
                                         super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string
                  ((string *)
                   &array.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cout,(string *)ptVar3);
        std::operator<<(poVar6," = [");
        TypeDescriptor::getArray
                  ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)local_a8,*ppTVar4)
        ;
        for (local_ac = 0; uVar7 = (ulong)local_ac,
            sVar8 = std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::size
                              ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)
                               local_a8), uVar7 < sVar8; local_ac = local_ac + 1) {
          if (local_ac != 0) {
            std::operator<<((ostream *)&std::cout,", ");
          }
          ppTVar9 = std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::operator[]
                              ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)
                               local_a8,(long)local_ac);
          ptVar5 = TypeDescriptor::type(*ppTVar9);
          if (*ptVar5 == NUMBER) {
            ppTVar9 = std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::operator[]
                                ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)
                                 local_a8,(long)local_ac);
            dVar10 = TypeDescriptor::getNumber(*ppTVar9);
            std::ostream::operator<<((ostream *)&std::cout,dVar10);
          }
          else {
            ppTVar9 = std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::operator[]
                                ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)
                                 local_a8,(long)local_ac);
            TypeDescriptor::getString_abi_cxx11_(&local_d0,*ppTVar9);
            std::operator<<((ostream *)&std::cout,(string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
          }
        }
        poVar6 = std::operator<<((ostream *)&std::cout,"] ");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::~vector
                  ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)local_a8);
      }
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>
             *)&var);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void SymTab::print() {
    for(auto [var, value] : symTab ) {
        if (value->type() == TypeDescriptor::NUMBER)
            std::cout << var << " = " << value->getNumber() << std::endl;
        else if (value->type() == TypeDescriptor::STRING) std::cout << var << " = " << value->getString() << std::endl;
        else { //Array
            std::cout << var << " = [";
            std::vector<TypeDescriptor*>array = value->getArray();

            for(int i = 0; i < array.size();i++){
                if(i != 0) std::cout << ", ";
                if(array[i]->type() == TypeDescriptor::NUMBER) std::cout << array[i]->getNumber();
                else std::cout << array[i]->getString();
            }
            std::cout << "] " << std::endl;

        }
    }

}